

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveArmArch(Parser *parser,int flags)

{
  int in_EDX;
  undefined4 in_register_00000034;
  unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_> local_48;
  unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_> local_40;
  unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_> local_38;
  unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_> local_30;
  unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_> local_28;
  int local_1c;
  undefined8 uStack_18;
  int flags_local;
  Parser *parser_local;
  
  uStack_18 = CONCAT44(in_register_00000034,flags);
  local_1c = in_EDX;
  parser_local = parser;
  Architecture::setCurrent(&Arm.super_Architecture);
  if (local_1c - 1U < 4 || local_1c == 5) {
    switch((long)&switchD_002069e0::switchdataD_00229e54 +
           (long)(int)(&switchD_002069e0::switchdataD_00229e54)[local_1c - 1U]) {
    case 0x2069e2:
      CArmArchitecture::SetThumbMode(&Arm,true);
      CArmArchitecture::setVersion(&Arm,AARCH_GBA);
      std::make_unique<ArchitectureCommand,char_const(&)[12],char_const(&)[7]>
                ((char (*) [12])&local_28,(char (*) [7])".gba\n.thumb");
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<ArchitectureCommand,std::default_delete<ArchitectureCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 &local_28);
      std::unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_>::~unique_ptr
                (&local_28);
      break;
    case 0x206a33:
      CArmArchitecture::SetThumbMode(&Arm,false);
      CArmArchitecture::setVersion(&Arm,AARCH_NDS);
      std::make_unique<ArchitectureCommand,char_const(&)[10],char_const(&)[5]>
                ((char (*) [10])&local_30,(char (*) [5])".nds\n.arm");
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<ArchitectureCommand,std::default_delete<ArchitectureCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 &local_30);
      std::unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_>::~unique_ptr
                (&local_30);
      break;
    case 0x206a84:
      CArmArchitecture::SetThumbMode(&Arm,false);
      CArmArchitecture::setVersion(&Arm,AARCH_3DS);
      std::make_unique<ArchitectureCommand,char_const(&)[10],char_const(&)[5]>
                ((char (*) [10])&local_38,(char (*) [5])".3ds\n.arm");
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<ArchitectureCommand,std::default_delete<ArchitectureCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 &local_38);
      std::unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_>::~unique_ptr
                (&local_38);
      break;
    case 0x206ad5:
      CArmArchitecture::SetThumbMode(&Arm,false);
      CArmArchitecture::setVersion(&Arm,AARCH_BIG);
      std::make_unique<ArchitectureCommand,char_const(&)[14],char_const(&)[5]>
                ((char (*) [14])&local_40,(char (*) [5])".arm.big\n.arm");
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<ArchitectureCommand,std::default_delete<ArchitectureCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 &local_40);
      std::unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_>::~unique_ptr
                (&local_40);
      break;
    case 0x206b23:
      CArmArchitecture::SetThumbMode(&Arm,false);
      CArmArchitecture::setVersion(&Arm,AARCH_LITTLE);
      std::make_unique<ArchitectureCommand,char_const(&)[17],char_const(&)[5]>
                ((char (*) [17])&local_48,(char (*) [5])".arm.little\n.arm");
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<ArchitectureCommand,std::default_delete<ArchitectureCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 &local_48);
      std::unique_ptr<ArchitectureCommand,_std::default_delete<ArchitectureCommand>_>::~unique_ptr
                (&local_48);
    }
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveArmArch(Parser& parser, int flags)
{
	Architecture::setCurrent(Arm);

	switch (flags)
	{
	case DIRECTIVE_ARM_GBA:
		Arm.SetThumbMode(true);
		Arm.setVersion(AARCH_GBA);
		return std::make_unique<ArchitectureCommand>(".gba\n.thumb", ".thumb");
	case DIRECTIVE_ARM_NDS:
		Arm.SetThumbMode(false);
		Arm.setVersion(AARCH_NDS);
		return std::make_unique<ArchitectureCommand>(".nds\n.arm", ".arm");
	case DIRECTIVE_ARM_3DS:
		Arm.SetThumbMode(false);
		Arm.setVersion(AARCH_3DS);
		return std::make_unique<ArchitectureCommand>(".3ds\n.arm", ".arm");
	case DIRECTIVE_ARM_BIG:
		Arm.SetThumbMode(false);
		Arm.setVersion(AARCH_BIG);
		return std::make_unique<ArchitectureCommand>(".arm.big\n.arm", ".arm");
	case DIRECTIVE_ARM_LITTLE:
		Arm.SetThumbMode(false);
		Arm.setVersion(AARCH_LITTLE);
		return std::make_unique<ArchitectureCommand>(".arm.little\n.arm", ".arm");
	}

	return nullptr;
}